

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  reverse_null();
  reverse_boolean();
  reverse_integer();
  reverse_real();
  reverse_string();
  reverse_array();
  reverse_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    reverse_null();
    reverse_boolean();
    reverse_integer();
    reverse_real();
    reverse_string();
    reverse_array();
    reverse_map();

    return boost::report_errors();
}